

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<int> * __thiscall asl::Array<int>::insert(Array<int> *this,int k,int *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  
  piVar5 = this->_a;
  iVar1 = piVar5[-4];
  iVar2 = piVar5[-3];
  iVar7 = k;
  if (k < 0) {
    iVar7 = iVar1;
  }
  if (iVar1 < iVar2) {
    piVar4 = piVar5 + -4;
LAB_0011be08:
    if (iVar1 - iVar7 != 0 && iVar7 <= iVar1) {
      memmove(piVar5 + (long)iVar7 + 1,piVar5 + iVar7,(long)(iVar1 - iVar7) << 2);
      piVar5 = this->_a;
    }
    piVar5[iVar7] = *x;
    *piVar4 = iVar1 + 1;
    return this;
  }
  if (iVar1 != 0x7fffffff) {
    dup(this,k);
    iVar3 = this->_a[-2];
    iVar8 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar8 = iVar2 * 2 + 2;
    }
    piVar4 = (int *)realloc(this->_a + -4,(long)iVar8 * 4 + 0x10);
    if (piVar4 != (int *)0x0) {
      piVar5 = piVar4 + 4;
      this->_a = piVar5;
      piVar4[1] = iVar8;
      piVar4[2] = iVar3;
      goto LAB_0011be08;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = dup2;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}